

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.h
# Opt level: O3

bool __thiscall ZXing::BitMatrix::get(BitMatrix *this,int x,int y)

{
  pointer puVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(y * this->_width + x);
  puVar1 = (this->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar2 < (ulong)((long)(this->_bits).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar1)) {
    return puVar1[uVar2] != '\0';
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

bool get(int x, int y) const { return get(y * _width + x); }